

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

int duckdb::BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,int,int,int>
              (bool fun,int left,int right,ValidityMask *mask,idx_t idx)

{
  int iVar1;
  undefined8 uVar2;
  int in_EDX;
  int in_ESI;
  idx_t in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  allocator local_41;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  OutOfRangeException *in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar1 = NumericLimits<int>::Minimum();
  if ((in_ESI == iVar1) && (in_EDX == -1)) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffc0,"Overflow in division of %d / %d",&local_41);
    OutOfRangeException::OutOfRangeException<int,int>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
               in_stack_ffffffffffffffc0);
    __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  if (in_EDX == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_4 = in_ESI;
  }
  else {
    local_4 = DivideOperator::Operation<int,int,int>(in_ESI,in_EDX);
  }
  return local_4;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		if (left == NumericLimits<LEFT_TYPE>::Minimum() && right == -1) {
			throw OutOfRangeException("Overflow in division of %d / %d", left, right);
		} else if (right == 0) {
			mask.SetInvalid(idx);
			return left;
		} else {
			return OP::template Operation<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(left, right);
		}
	}